

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void tf_build_predictor(YV12_BUFFER_CONFIG *ref_frame,MACROBLOCKD *mbd,BLOCK_SIZE block_size,
                       int mb_row,int mb_col,int num_planes,scale_factors *scale,MV *subblock_mvs,
                       uint8_t *pred)

{
  int in_ECX;
  byte in_DL;
  long in_RSI;
  YV12_BUFFER_CONFIG *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 in_stack_00000008;
  long in_stack_00000010;
  InterPredParams inter_pred_params;
  int x;
  int y;
  MV mv;
  int j;
  int i;
  int subblock_idx;
  buf_2d ref_buf;
  int is_y_plane;
  int w;
  int h;
  int plane_x;
  int plane_y;
  int plane_w;
  int plane_h;
  int subsampling_x;
  int subsampling_y;
  int plane;
  int plane_offset;
  int_interpfilters interp_filters;
  int is_high_bitdepth;
  int is_intrabc;
  int bit_depth;
  int mb_x;
  int mb_y;
  int mb_width;
  int mb_height;
  undefined4 uVar1;
  undefined4 in_stack_fffffffffffffdfc;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe04;
  int in_stack_fffffffffffffe0c;
  int plane_00;
  int in_stack_fffffffffffffe14;
  int in_stack_fffffffffffffe2c;
  InterPredParams *in_stack_fffffffffffffe30;
  undefined1 local_1c8 [4];
  int_interpfilters in_stack_fffffffffffffe3c;
  int in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  scale_factors *in_stack_fffffffffffffe70;
  buf_2d *in_stack_fffffffffffffe78;
  undefined1 auStack_168 [208];
  int local_98;
  int local_94;
  undefined4 local_90;
  uint local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  undefined4 local_68;
  undefined4 local_64;
  int local_60;
  int local_5c;
  int_interpfilters local_58;
  int local_54;
  undefined4 local_50;
  undefined4 local_4c;
  int local_48;
  int local_44;
  uint local_40;
  uint local_3c;
  int local_38;
  long local_28;
  YV12_BUFFER_CONFIG *local_20;
  
  local_3c = (uint)block_size_high[in_DL];
  local_40 = (uint)block_size_wide[in_DL];
  local_44 = local_3c * in_ECX;
  local_48 = local_40 * in_R8D;
  local_4c = *(undefined4 *)(in_RSI + 0x29a0);
  local_50 = 0;
  local_38 = in_R9D;
  local_28 = in_RSI;
  local_20 = in_RDI;
  local_54 = is_frame_high_bitdepth(in_RDI);
  local_58 = av1_broadcast_interp_filter(MULTITAP_SHARP2);
  local_5c = 0;
  for (local_60 = 0; local_60 < local_38; local_60 = local_60 + 1) {
    local_64 = *(undefined4 *)(local_28 + (long)local_60 * 0xa30 + 0x18);
    local_68 = *(undefined4 *)(local_28 + (long)local_60 * 0xa30 + 0x14);
    local_6c = (int)local_3c >> ((byte)local_64 & 0x1f);
    local_70 = (int)local_40 >> ((byte)local_68 & 0x1f);
    local_74 = local_44 >> ((byte)local_64 & 0x1f);
    local_78 = local_48 >> ((byte)local_68 & 0x1f);
    local_7c = local_6c >> 1;
    local_80 = local_70 >> 1;
    local_84 = (uint)(local_60 == 0);
    auStack_168[0xc0] = '\0';
    auStack_168[0xc1] = '\0';
    auStack_168[0xc2] = '\0';
    auStack_168[0xc3] = '\0';
    auStack_168._196_4_ = 0;
    auStack_168._200_8_ = local_20->store_buf_adr[(long)local_60 + -4];
    local_98 = *(int *)((long)local_20->store_buf_adr + (long)(int)(uint)(local_84 == 0) * 4 + -0x48
                       );
    local_94 = *(int *)((long)local_20->store_buf_adr + (long)(int)(uint)(local_84 == 0) * 4 + -0x40
                       );
    local_90 = *(undefined4 *)
                ((long)local_20->store_buf_adr + (long)(int)(uint)(local_84 == 0) * 4 + -0x28);
    auStack_168._188_4_ = 0;
    for (auStack_168._184_4_ = 0; (int)auStack_168._184_4_ < local_6c;
        auStack_168._184_4_ = local_7c + auStack_168._184_4_) {
      for (auStack_168._180_4_ = 0; (int)auStack_168._180_4_ < local_70;
          auStack_168._180_4_ = local_80 + auStack_168._180_4_) {
        auStack_168._176_4_ = *(int *)(in_stack_00000010 + (long)(int)auStack_168._188_4_ * 4);
        auStack_168._172_4_ = local_74 + auStack_168._184_4_;
        auStack_168._168_4_ = local_78 + auStack_168._180_4_;
        plane_00 = 0;
        uVar1 = local_64;
        uVar2 = local_4c;
        auStack_168._188_4_ = auStack_168._188_4_ + 1;
        av1_init_inter_params
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,local_58.as_int,
                   (int)((ulong)(auStack_168 + 0xc0) >> 0x20),(int)(auStack_168 + 0xc0),
                   (int)((ulong)in_stack_00000008 >> 0x20),in_stack_fffffffffffffe50,
                   in_stack_fffffffffffffe58,in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,
                   in_stack_fffffffffffffe70,in_stack_fffffffffffffe78,in_stack_fffffffffffffe3c);
        in_stack_fffffffffffffe30 = (InterPredParams *)auStack_168;
        get_conv_params(in_stack_fffffffffffffe14,plane_00,in_stack_fffffffffffffe0c);
        memcpy(in_stack_fffffffffffffe30,local_1c8,0x30);
        av1_enc_build_one_inter_predictor
                  ((uint8_t *)CONCAT44(in_stack_fffffffffffffe14,plane_00),in_stack_fffffffffffffe0c
                   ,(MV *)CONCAT44(in_stack_fffffffffffffe04,uVar2),
                   (InterPredParams *)CONCAT44(in_stack_fffffffffffffdfc,uVar1));
      }
    }
    local_5c = local_6c * local_70 + local_5c;
  }
  return;
}

Assistant:

static void tf_build_predictor(const YV12_BUFFER_CONFIG *ref_frame,
                               const MACROBLOCKD *mbd,
                               const BLOCK_SIZE block_size, const int mb_row,
                               const int mb_col, const int num_planes,
                               const struct scale_factors *scale,
                               const MV *subblock_mvs, uint8_t *pred) {
  // Information of the entire block.
  const int mb_height = block_size_high[block_size];  // Height.
  const int mb_width = block_size_wide[block_size];   // Width.
  const int mb_y = mb_height * mb_row;                // Y-coord (Top-left).
  const int mb_x = mb_width * mb_col;                 // X-coord (Top-left).
  const int bit_depth = mbd->bd;                      // Bit depth.
  const int is_intrabc = 0;                           // Is intra-copied?
  const int is_high_bitdepth = is_frame_high_bitdepth(ref_frame);

  // Default interpolation filters.
  const int_interpfilters interp_filters =
      av1_broadcast_interp_filter(MULTITAP_SHARP2);

  // Handle Y-plane, U-plane and V-plane (if needed) in sequence.
  int plane_offset = 0;
  for (int plane = 0; plane < num_planes; ++plane) {
    const int subsampling_y = mbd->plane[plane].subsampling_y;
    const int subsampling_x = mbd->plane[plane].subsampling_x;
    // Information of each sub-block in current plane.
    const int plane_h = mb_height >> subsampling_y;  // Plane height.
    const int plane_w = mb_width >> subsampling_x;   // Plane width.
    const int plane_y = mb_y >> subsampling_y;       // Y-coord (Top-left).
    const int plane_x = mb_x >> subsampling_x;       // X-coord (Top-left).
    const int h = plane_h >> 1;                      // Sub-block height.
    const int w = plane_w >> 1;                      // Sub-block width.
    const int is_y_plane = (plane == 0);             // Is Y-plane?

    const struct buf_2d ref_buf = { NULL, ref_frame->buffers[plane],
                                    ref_frame->widths[is_y_plane ? 0 : 1],
                                    ref_frame->heights[is_y_plane ? 0 : 1],
                                    ref_frame->strides[is_y_plane ? 0 : 1] };

    // Handle each subblock.
    int subblock_idx = 0;
    for (int i = 0; i < plane_h; i += h) {
      for (int j = 0; j < plane_w; j += w) {
        // Choose proper motion vector.
        const MV mv = subblock_mvs[subblock_idx++];
        assert(mv.row >= INT16_MIN && mv.row <= INT16_MAX &&
               mv.col >= INT16_MIN && mv.col <= INT16_MAX);

        const int y = plane_y + i;
        const int x = plane_x + j;

        // Build predictior for each sub-block on current plane.
        InterPredParams inter_pred_params;
        av1_init_inter_params(&inter_pred_params, w, h, y, x, subsampling_x,
                              subsampling_y, bit_depth, is_high_bitdepth,
                              is_intrabc, scale, &ref_buf, interp_filters);
        inter_pred_params.conv_params = get_conv_params(0, plane, bit_depth);
        av1_enc_build_one_inter_predictor(&pred[plane_offset + i * plane_w + j],
                                          plane_w, &mv, &inter_pred_params);
      }
    }
    plane_offset += plane_h * plane_w;
  }
}